

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void err_info_about_objects(char *func,QObject *sender,QObject *receiver)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_90;
  QMessageLogger local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QObject::objectName((QString *)&local_38,sender);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (receiver == (QObject *)0x0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
  }
  else {
    QObject::objectName((QString *)&local_58,receiver);
  }
  if ((undefined1 *)local_38.size != (undefined1 *)0x0) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_78.context.version = 2;
      local_78.context._4_8_ = 0;
      local_78.context._12_8_ = 0;
      local_78.context.function._4_4_ = 0;
      local_78.context.category = lcConnect::category.name;
      QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_38);
      pcVar1 = QByteArray::data((QByteArray *)&local_90);
      QMessageLogger::warning(&local_78,"QObject::%s:  (sender name:   \'%s\')",func,pcVar1);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    }
  }
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_78.context.version = 2;
      local_78.context._4_8_ = 0;
      local_78.context._12_8_ = 0;
      local_78.context.function._4_4_ = 0;
      local_78.context.category = lcConnect::category.name;
      QString::toLocal8Bit((QByteArray *)&local_90,(QString *)&local_58);
      pcVar1 = QByteArray::data((QByteArray *)&local_90);
      QMessageLogger::warning(&local_78,"QObject::%s:  (receiver name: \'%s\')",func,pcVar1);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_DECL_COLD_FUNCTION
static void err_info_about_objects(const char *func, const QObject *sender, const QObject *receiver)
{
    QString a = sender ? sender->objectName() : QString();
    QString b = receiver ? receiver->objectName() : QString();
    if (!a.isEmpty())
        qCWarning(lcConnect, "QObject::%s:  (sender name:   '%s')", func, a.toLocal8Bit().data());
    if (!b.isEmpty())
        qCWarning(lcConnect, "QObject::%s:  (receiver name: '%s')", func, b.toLocal8Bit().data());
}